

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTargetCompileFeaturesCommand.cxx
# Opt level: O1

bool __thiscall
anon_unknown.dwarf_1605198::TargetCompileFeaturesImpl::HandleDirectContent
          (TargetCompileFeaturesImpl *this,cmTarget *tgt,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *content,bool param_3,bool param_4)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pbVar2;
  bool bVar3;
  pointer feature;
  bool bVar4;
  string error;
  cmStandardLevelResolver standardResolver;
  string local_60;
  cmTargetPropCommandBase *local_40;
  cmStandardLevelResolver local_38;
  
  local_38.Makefile = (this->super_cmTargetPropCommandBase).Makefile;
  feature = (content->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pbVar2 = (content->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  bVar4 = feature == pbVar2;
  if (!bVar4) {
    paVar1 = &local_60.field_2;
    local_40 = &this->super_cmTargetPropCommandBase;
    do {
      local_60._M_string_length = 0;
      local_60.field_2._M_local_buf[0] = '\0';
      local_60._M_dataplus._M_p = (pointer)paVar1;
      bVar3 = cmStandardLevelResolver::AddRequiredTargetFeature(&local_38,tgt,feature,&local_60);
      if (bVar3) {
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_60._M_dataplus._M_p != paVar1) {
          operator_delete(local_60._M_dataplus._M_p,
                          CONCAT71(local_60.field_2._M_allocated_capacity._1_7_,
                                   local_60.field_2._M_local_buf[0]) + 1);
        }
      }
      else {
        cmTargetPropCommandBase::SetError(local_40,&local_60);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_60._M_dataplus._M_p != paVar1) {
          operator_delete(local_60._M_dataplus._M_p,
                          CONCAT71(local_60.field_2._M_allocated_capacity._1_7_,
                                   local_60.field_2._M_local_buf[0]) + 1);
        }
        if (!bVar3) {
          return bVar4;
        }
      }
      feature = feature + 1;
      bVar4 = feature == pbVar2;
    } while (!bVar4);
  }
  return bVar4;
}

Assistant:

bool HandleDirectContent(cmTarget* tgt,
                           const std::vector<std::string>& content,
                           bool /*prepend*/, bool /*system*/) override
  {
    cmStandardLevelResolver standardResolver(this->Makefile);
    for (std::string const& it : content) {
      std::string error;
      if (!standardResolver.AddRequiredTargetFeature(tgt, it, &error)) {
        this->SetError(error);
        return false; // Not (successfully) handled.
      }
    }
    return true; // Successfully handled.
  }